

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O0

uint32_t read_vbyte(FILE *f)

{
  size_t sVar1;
  FILE *in_RDI;
  int ret;
  uint8_t chr;
  uint shift;
  uint32_t x;
  byte local_11;
  int local_10;
  uint32_t local_c;
  FILE *local_8;
  
  local_c = 0;
  local_10 = 0;
  local_11 = 0;
  local_8 = in_RDI;
  while( true ) {
    sVar1 = fread(&local_11,1,1,local_8);
    if ((int)sVar1 != 1) {
      quit("reading vbyte from file: %d != %d",sVar1 & 0xffffffff,1);
    }
    local_c = ((local_11 & 0x7f) << ((byte)local_10 & 0x1f)) + local_c;
    if ((local_11 & 0x80) == 0) break;
    local_10 = local_10 + 7;
  }
  return local_c;
}

Assistant:

uint32_t read_vbyte(FILE* f)
{
    uint32_t x = 0;
    unsigned int shift = 0;
    uint8_t chr = 0;
    while (true) {
        int ret = fread(&chr, 1, 1, f);
        if (ret != 1) {
            quit("reading vbyte from file: %d != %d", ret, 1);
        }
        x += ((chr & 127) << shift);
        if (!(chr & 128)) {
            return x;
        }
        shift += 7;
    }
}